

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

char * gl4cts::TextureViewUtilities::getInternalformatString(GLenum internalformat)

{
  char *pcVar1;
  TestError *this;
  
  switch(internalformat) {
  case 0x8229:
    pcVar1 = "GL_R8";
    break;
  case 0x822a:
    pcVar1 = "GL_R16";
    break;
  case 0x822b:
    pcVar1 = "GL_RG8";
    break;
  case 0x822c:
    pcVar1 = "GL_RG16";
    break;
  case 0x822d:
    pcVar1 = "GL_R16F";
    break;
  case 0x822e:
    pcVar1 = "GL_R32F";
    break;
  case 0x822f:
    pcVar1 = "GL_RG16F";
    break;
  case 0x8230:
    pcVar1 = "GL_RG32F";
    break;
  case 0x8231:
    pcVar1 = "GL_R8I";
    break;
  case 0x8232:
    pcVar1 = "GL_R8UI";
    break;
  case 0x8233:
    pcVar1 = "GL_R16I";
    break;
  case 0x8234:
    pcVar1 = "GL_R16UI";
    break;
  case 0x8235:
    pcVar1 = "GL_R32I";
    break;
  case 0x8236:
    pcVar1 = "GL_R32UI";
    break;
  case 0x8237:
    pcVar1 = "GL_RG8I";
    break;
  case 0x8238:
    pcVar1 = "GL_RG8UI";
    break;
  case 0x8239:
    pcVar1 = "GL_RG16I";
    break;
  case 0x823a:
    pcVar1 = "GL_RG16UI";
    break;
  case 0x823b:
    pcVar1 = "GL_RG32I";
    break;
  case 0x823c:
    pcVar1 = "GL_RG32UI";
    break;
  default:
    switch(internalformat) {
    case 0x9270:
      pcVar1 = "GL_COMPRESSED_R11_EAC";
      break;
    case 0x9271:
      pcVar1 = "GL_COMPRESSED_SIGNED_R11_EAC";
      break;
    case 0x9272:
      pcVar1 = "GL_COMPRESSED_RG11_EAC";
      break;
    case 0x9273:
      pcVar1 = "GL_COMPRESSED_SIGNED_RG11_EAC";
      break;
    case 0x9274:
      pcVar1 = "GL_COMPRESSED_RGB8_ETC2";
      break;
    case 0x9275:
      pcVar1 = "GL_COMPRESSED_SRGB8_ETC2";
      break;
    case 0x9276:
      pcVar1 = "GL_COMPRESSED_RGB8_PUNCHTHROUGH_ALPHA1_ETC2";
      break;
    case 0x9277:
      pcVar1 = "GL_COMPRESSED_SRGB8_PUNCHTHROUGH_ALPHA1_ETC2";
      break;
    case 0x9278:
      pcVar1 = "GL_COMPRESSED_RGBA8_ETC2_EAC";
      break;
    case 0x9279:
      pcVar1 = "GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC";
      break;
    default:
      switch(internalformat) {
      case 0x8d70:
        pcVar1 = "GL_RGBA32UI";
        break;
      case 0x8d71:
        pcVar1 = "GL_RGB32UI";
        break;
      case 0x8d72:
      case 0x8d73:
      case 0x8d74:
      case 0x8d75:
      case 0x8d78:
      case 0x8d79:
      case 0x8d7a:
      case 0x8d7b:
      case 0x8d7e:
      case 0x8d7f:
      case 0x8d80:
      case 0x8d81:
        goto switchD_00aa9fb6_caseD_8d8a;
      case 0x8d76:
        pcVar1 = "GL_RGBA16UI";
        break;
      case 0x8d77:
        pcVar1 = "GL_RGB16UI";
        break;
      case 0x8d7c:
        pcVar1 = "GL_RGBA8UI";
        break;
      case 0x8d7d:
        pcVar1 = "GL_RGB8UI";
        break;
      case 0x8d82:
        pcVar1 = "GL_RGBA32I";
        break;
      case 0x8d83:
        pcVar1 = "GL_RGB32I";
        break;
      default:
        switch(internalformat) {
        case 0x8f94:
          pcVar1 = "GL_R8_SNORM";
          break;
        case 0x8f95:
          pcVar1 = "GL_RG8_SNORM";
          break;
        case 0x8f96:
          pcVar1 = "GL_RGB8_SNORM";
          break;
        case 0x8f97:
          pcVar1 = "GL_RGBA8_SNORM";
          break;
        case 0x8f98:
          pcVar1 = "GL_R16_SNORM";
          break;
        case 0x8f99:
          pcVar1 = "GL_RG16_SNORM";
          break;
        case 0x8f9a:
          pcVar1 = "GL_RGB16_SNORM";
          break;
        case 0x8f9b:
          pcVar1 = "GL_RGBA16_SNORM";
          break;
        default:
          switch(internalformat) {
          case 0x8051:
            pcVar1 = "GL_RGB8";
            break;
          case 0x8052:
          case 0x8053:
          case 0x8055:
          case 0x805a:
switchD_00aa9fb6_caseD_8d8a:
            this = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this,"Unrecognized internalformat",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                       ,0x610);
            __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          case 0x8054:
            pcVar1 = "GL_RGB16";
            break;
          case 0x8056:
            pcVar1 = "GL_RGBA4";
            break;
          case 0x8057:
            pcVar1 = "GL_RGB5_A1";
            break;
          case 0x8058:
            pcVar1 = "GL_RGBA8";
            break;
          case 0x8059:
            pcVar1 = "GL_RGB10_A2";
            break;
          case 0x805b:
            pcVar1 = "GL_RGBA16";
            break;
          default:
            switch(internalformat) {
            case 0x8814:
              pcVar1 = "GL_RGBA32F";
              break;
            case 0x8815:
              pcVar1 = "GL_RGB32F";
              break;
            case 0x8816:
            case 0x8817:
            case 0x8818:
            case 0x8819:
              goto switchD_00aa9fb6_caseD_8d8a;
            case 0x881a:
              pcVar1 = "GL_RGBA16F";
              break;
            case 0x881b:
              pcVar1 = "GL_RGB16F";
              break;
            default:
              switch(internalformat) {
              case 0x8c3a:
                pcVar1 = "GL_R11F_G11F_B10F";
                break;
              case 0x8c3b:
              case 0x8c3c:
              case 0x8c3e:
              case 0x8c3f:
              case 0x8c40:
              case 0x8c42:
                goto switchD_00aa9fb6_caseD_8d8a;
              case 0x8c3d:
                pcVar1 = "GL_RGB9_E5";
                break;
              case 0x8c41:
                pcVar1 = "GL_SRGB8";
                break;
              case 0x8c43:
                pcVar1 = "GL_SRGB8_ALPHA8";
                break;
              default:
                switch(internalformat) {
                case 0x8d88:
                  pcVar1 = "GL_RGBA16I";
                  break;
                case 0x8d89:
                  pcVar1 = "GL_RGB16I";
                  break;
                case 0x8d8a:
                case 0x8d8b:
                case 0x8d8c:
                case 0x8d8d:
                  goto switchD_00aa9fb6_caseD_8d8a;
                case 0x8d8e:
                  pcVar1 = "GL_RGBA8I";
                  break;
                case 0x8d8f:
                  pcVar1 = "GL_RGB8I";
                  break;
                default:
                  switch(internalformat) {
                  case 0x8dbb:
                    pcVar1 = "GL_COMPRESSED_RED_RGTC1";
                    break;
                  case 0x8dbc:
                    pcVar1 = "GL_COMPRESSED_SIGNED_RED_RGTC1";
                    break;
                  case 0x8dbd:
                    pcVar1 = "GL_COMPRESSED_RG_RGTC2";
                    break;
                  case 0x8dbe:
                    pcVar1 = "GL_COMPRESSED_SIGNED_RG_RGTC2";
                    break;
                  default:
                    switch(internalformat) {
                    case 0x8e8c:
                      pcVar1 = "GL_COMPRESSED_RGBA_BPTC_UNORM";
                      break;
                    case 0x8e8d:
                      pcVar1 = "GL_COMPRESSED_SRGB_ALPHA_BPTC_UNORM";
                      break;
                    case 0x8e8e:
                      pcVar1 = "GL_COMPRESSED_RGB_BPTC_SIGNED_FLOAT";
                      break;
                    case 0x8e8f:
                      pcVar1 = "GL_COMPRESSED_RGB_BPTC_UNSIGNED_FLOAT";
                      break;
                    default:
                      if (internalformat == 0x81a5) {
                        pcVar1 = "GL_DEPTH_COMPONENT16";
                      }
                      else if (internalformat == 0x81a6) {
                        pcVar1 = "GL_DEPTH_COMPONENT24";
                      }
                      else if (internalformat == 0x88f0) {
                        pcVar1 = "GL_DEPTH24_STENCIL8";
                      }
                      else if (internalformat == 0x8cac) {
                        pcVar1 = "GL_DEPTH_COMPONENT32F";
                      }
                      else if (internalformat == 0x8cad) {
                        pcVar1 = "GL_DEPTH32F_STENCIL8";
                      }
                      else if (internalformat == 0x8d62) {
                        pcVar1 = "GL_RGB565";
                      }
                      else {
                        if (internalformat != 0x906f) goto switchD_00aa9fb6_caseD_8d8a;
                        pcVar1 = "GL_RGB10_A2UI";
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return pcVar1;
}

Assistant:

const char* TextureViewUtilities::getInternalformatString(const glw::GLenum internalformat)
{
	const char* result = "[?]";

	switch (internalformat)
	{
	case GL_RGBA32F:
		result = "GL_RGBA32F";
		break;
	case GL_RGBA32I:
		result = "GL_RGBA32I";
		break;
	case GL_RGBA32UI:
		result = "GL_RGBA32UI";
		break;
	case GL_RGBA16:
		result = "GL_RGBA16";
		break;
	case GL_RGBA16F:
		result = "GL_RGBA16F";
		break;
	case GL_RGBA16I:
		result = "GL_RGBA16I";
		break;
	case GL_RGBA16UI:
		result = "GL_RGBA16UI";
		break;
	case GL_RGBA8:
		result = "GL_RGBA8";
		break;
	case GL_RGBA8I:
		result = "GL_RGBA8I";
		break;
	case GL_RGBA8UI:
		result = "GL_RGBA8UI";
		break;
	case GL_SRGB8_ALPHA8:
		result = "GL_SRGB8_ALPHA8";
		break;
	case GL_RGB10_A2:
		result = "GL_RGB10_A2";
		break;
	case GL_RGB10_A2UI:
		result = "GL_RGB10_A2UI";
		break;
	case GL_RGB5_A1:
		result = "GL_RGB5_A1";
		break;
	case GL_RGBA4:
		result = "GL_RGBA4";
		break;
	case GL_R11F_G11F_B10F:
		result = "GL_R11F_G11F_B10F";
		break;
	case GL_RGB565:
		result = "GL_RGB565";
		break;
	case GL_RG32F:
		result = "GL_RG32F";
		break;
	case GL_RG32I:
		result = "GL_RG32I";
		break;
	case GL_RG32UI:
		result = "GL_RG32UI";
		break;
	case GL_RG16:
		result = "GL_RG16";
		break;
	case GL_RG16F:
		result = "GL_RG16F";
		break;
	case GL_RG16I:
		result = "GL_RG16I";
		break;
	case GL_RG16UI:
		result = "GL_RG16UI";
		break;
	case GL_RG8:
		result = "GL_RG8";
		break;
	case GL_RG8I:
		result = "GL_RG8I";
		break;
	case GL_RG8UI:
		result = "GL_RG8UI";
		break;
	case GL_R32F:
		result = "GL_R32F";
		break;
	case GL_R32I:
		result = "GL_R32I";
		break;
	case GL_R32UI:
		result = "GL_R32UI";
		break;
	case GL_R16F:
		result = "GL_R16F";
		break;
	case GL_R16I:
		result = "GL_R16I";
		break;
	case GL_R16UI:
		result = "GL_R16UI";
		break;
	case GL_R16:
		result = "GL_R16";
		break;
	case GL_R8:
		result = "GL_R8";
		break;
	case GL_R8I:
		result = "GL_R8I";
		break;
	case GL_R8UI:
		result = "GL_R8UI";
		break;
	case GL_RGBA16_SNORM:
		result = "GL_RGBA16_SNORM";
		break;
	case GL_RGBA8_SNORM:
		result = "GL_RGBA8_SNORM";
		break;
	case GL_RGB32F:
		result = "GL_RGB32F";
		break;
	case GL_RGB32I:
		result = "GL_RGB32I";
		break;
	case GL_RGB32UI:
		result = "GL_RGB32UI";
		break;
	case GL_RGB16_SNORM:
		result = "GL_RGB16_SNORM";
		break;
	case GL_RGB16F:
		result = "GL_RGB16F";
		break;
	case GL_RGB16I:
		result = "GL_RGB16I";
		break;
	case GL_RGB16UI:
		result = "GL_RGB16UI";
		break;
	case GL_RGB16:
		result = "GL_RGB16";
		break;
	case GL_RGB8_SNORM:
		result = "GL_RGB8_SNORM";
		break;
	case GL_RGB8:
		result = "GL_RGB8";
		break;
	case GL_RGB8I:
		result = "GL_RGB8I";
		break;
	case GL_RGB8UI:
		result = "GL_RGB8UI";
		break;
	case GL_SRGB8:
		result = "GL_SRGB8";
		break;
	case GL_RGB9_E5:
		result = "GL_RGB9_E5";
		break;
	case GL_RG16_SNORM:
		result = "GL_RG16_SNORM";
		break;
	case GL_RG8_SNORM:
		result = "GL_RG8_SNORM";
		break;
	case GL_R16_SNORM:
		result = "GL_R16_SNORM";
		break;
	case GL_R8_SNORM:
		result = "GL_R8_SNORM";
		break;
	case GL_DEPTH_COMPONENT32F:
		result = "GL_DEPTH_COMPONENT32F";
		break;
	case GL_DEPTH_COMPONENT24:
		result = "GL_DEPTH_COMPONENT24";
		break;
	case GL_DEPTH_COMPONENT16:
		result = "GL_DEPTH_COMPONENT16";
		break;
	case GL_DEPTH32F_STENCIL8:
		result = "GL_DEPTH32F_STENCIL8";
		break;
	case GL_DEPTH24_STENCIL8:
		result = "GL_DEPTH24_STENCIL8";
		break;
	case GL_COMPRESSED_RED_RGTC1:
		result = "GL_COMPRESSED_RED_RGTC1";
		break;
	case GL_COMPRESSED_SIGNED_RED_RGTC1:
		result = "GL_COMPRESSED_SIGNED_RED_RGTC1";
		break;
	case GL_COMPRESSED_RG_RGTC2:
		result = "GL_COMPRESSED_RG_RGTC2";
		break;
	case GL_COMPRESSED_SIGNED_RG_RGTC2:
		result = "GL_COMPRESSED_SIGNED_RG_RGTC2";
		break;
	case GL_COMPRESSED_RGBA_BPTC_UNORM:
		result = "GL_COMPRESSED_RGBA_BPTC_UNORM";
		break;
	case GL_COMPRESSED_SRGB_ALPHA_BPTC_UNORM:
		result = "GL_COMPRESSED_SRGB_ALPHA_BPTC_UNORM";
		break;
	case GL_COMPRESSED_RGB_BPTC_SIGNED_FLOAT:
		result = "GL_COMPRESSED_RGB_BPTC_SIGNED_FLOAT";
		break;
	case GL_COMPRESSED_RGB_BPTC_UNSIGNED_FLOAT:
		result = "GL_COMPRESSED_RGB_BPTC_UNSIGNED_FLOAT";
		break;
	case GL_COMPRESSED_RGB8_ETC2:
		result = "GL_COMPRESSED_RGB8_ETC2";
		break;
	case GL_COMPRESSED_SRGB8_ETC2:
		result = "GL_COMPRESSED_SRGB8_ETC2";
		break;
	case GL_COMPRESSED_RGB8_PUNCHTHROUGH_ALPHA1_ETC2:
		result = "GL_COMPRESSED_RGB8_PUNCHTHROUGH_ALPHA1_ETC2";
		break;
	case GL_COMPRESSED_SRGB8_PUNCHTHROUGH_ALPHA1_ETC2:
		result = "GL_COMPRESSED_SRGB8_PUNCHTHROUGH_ALPHA1_ETC2";
		break;
	case GL_COMPRESSED_RGBA8_ETC2_EAC:
		result = "GL_COMPRESSED_RGBA8_ETC2_EAC";
		break;
	case GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC:
		result = "GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC";
		break;
	case GL_COMPRESSED_R11_EAC:
		result = "GL_COMPRESSED_R11_EAC";
		break;
	case GL_COMPRESSED_SIGNED_R11_EAC:
		result = "GL_COMPRESSED_SIGNED_R11_EAC";
		break;
	case GL_COMPRESSED_RG11_EAC:
		result = "GL_COMPRESSED_RG11_EAC";
		break;
	case GL_COMPRESSED_SIGNED_RG11_EAC:
		result = "GL_COMPRESSED_SIGNED_RG11_EAC";
		break;

	default:
		TCU_FAIL("Unrecognized internalformat");
	}

	return result;
}